

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  char *label_00;
  bool bVar6;
  byte bVar7;
  ImU32 id;
  uint uVar8;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  ImGuiTabItemFlags flags_00;
  ImGuiCol idx;
  int iVar13;
  undefined7 uVar15;
  undefined8 uVar14;
  long lVar16;
  ImGuiTabItem *pIVar17;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  bool bVar20;
  bool held;
  ImRect bb;
  bool hovered;
  ImVec2 local_90;
  ImRect local_88;
  ImGuiContext *local_78;
  ImGuiWindow *local_70;
  undefined1 local_68 [24];
  ImVec2 local_50;
  bool *local_48;
  ImVec2 local_40;
  char *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    uVar14 = 0;
LAB_00151893:
    local_88.Max.x = -3.4028235e+38;
    local_88.Max.y = -3.4028235e+38;
    local_88.Min.x = 3.4028235e+38;
    local_88.Min.y = 3.4028235e+38;
    ItemAdd(&local_88,id,(ImRect *)0x0);
    PopItemFlag();
    return SUB81(uVar14,0);
  }
  IVar4 = TabItemCalcSize(label,p_open != (bool *)0x0);
  fVar18 = IVar4.x;
  fVar19 = IVar4.y;
  uVar8 = (tab_bar->Tabs).Size;
  local_70 = pIVar3;
  local_48 = p_open;
  local_38 = label;
  if (0 < (int)uVar8 && id != 0) {
    pIVar9 = (tab_bar->Tabs).Data;
    lVar16 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar9->ID + lVar16) == id) {
        pIVar17 = (ImGuiTabItem *)((long)&pIVar9->ID + lVar16);
        bVar7 = 0;
        goto LAB_0015179f;
      }
      lVar16 = lVar16 + 0x1c;
    } while ((ulong)uVar8 * 0x1c != lVar16);
  }
  if (uVar8 == (tab_bar->Tabs).Capacity) {
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_4_ = IVar4.x;
    local_68._4_4_ = IVar4.y;
    local_68._12_4_ = extraout_XMM0_Dd;
    if (uVar8 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = (int)uVar8 / 2 + uVar8;
    }
    iVar12 = uVar8 + 1;
    if ((int)(uVar8 + 1) < iVar11) {
      iVar12 = iVar11;
    }
    pIVar9 = (ImGuiTabItem *)MemAlloc((long)iVar12 * 0x1c);
    pIVar17 = (tab_bar->Tabs).Data;
    if (pIVar17 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar9,pIVar17,(long)(tab_bar->Tabs).Size * 0x1c);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar9;
    (tab_bar->Tabs).Capacity = iVar12;
    uVar8 = (tab_bar->Tabs).Size;
    fVar18 = (float)local_68._0_4_;
    fVar19 = (float)local_68._4_4_;
  }
  else {
    pIVar9 = (tab_bar->Tabs).Data;
  }
  pIVar17 = pIVar9 + (int)uVar8;
  pIVar17->ID = 0;
  pIVar17->Flags = 0;
  pIVar17->LastFrameVisible = -1;
  pIVar17->LastFrameSelected = -1;
  pIVar9[(int)uVar8].Offset = 0.0;
  pIVar9[(int)uVar8].Width = 0.0;
  pIVar9[(int)uVar8].WidthContents = 0.0;
  iVar11 = (tab_bar->Tabs).Size;
  (tab_bar->Tabs).Size = iVar11 + 1;
  pIVar9 = (tab_bar->Tabs).Data;
  pIVar17 = pIVar9 + iVar11;
  pIVar17->ID = id;
  pIVar17->Width = fVar18;
  bVar7 = 1;
LAB_0015179f:
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar17 - (int)pIVar9) >> 2) * 0x6db7;
  pIVar17->WidthContents = fVar18;
  uVar8 = tab_bar->Flags;
  iVar12 = tab_bar->PrevFrameVisible + 1;
  iVar11 = pIVar5->FrameCount;
  iVar13 = pIVar17->LastFrameVisible + 1;
  pIVar17->LastFrameVisible = iVar11;
  pIVar17->Flags = flags;
  if (iVar13 < iVar11) {
    if ((((uVar8 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar11 <= iVar12 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((uVar8 & 1) == 0) {
    fVar18 = tab_bar->OffsetNextTab;
    pIVar17->Offset = fVar18;
    tab_bar->OffsetNextTab = pIVar17->Width + (pIVar5->Style).ItemInnerSpacing.x + fVar18;
  }
  uVar15 = (undefined7)((ulong)label >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar14 = CONCAT71(uVar15,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar12 < iVar11) && ((tab_bar->Tabs).Size == 1)) {
    uVar14 = CONCAT71(uVar15,(uVar8 & 2) == 0);
  }
  else {
    uVar14 = 0;
  }
  if ((bool)((bVar7 | iVar11 <= iVar12) & iVar13 < iVar11)) {
    PushItemFlag(0x18,true);
    goto LAB_00151893;
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar17->LastFrameSelected = iVar11;
  }
  local_68._0_8_ = uVar14;
  local_50 = (local_70->DC).CursorPos;
  local_88.Max.x = pIVar17->Width;
  IVar4 = (tab_bar->BarRect).Min;
  local_88.Min.x = ((float)(int)pIVar17->Offset - tab_bar->ScrollingAnim) + IVar4.x;
  local_88.Min.y = IVar4.y + 0.0;
  IVar4.y = local_88.Min.y;
  IVar4.x = local_88.Min.x;
  (local_70->DC).CursorPos = IVar4;
  local_88.Max.x = local_88.Max.x + local_88.Min.x;
  local_88.Max.y = fVar19 + local_88.Min.y;
  fVar18 = (tab_bar->BarRect).Min.x;
  fVar2 = (tab_bar->BarRect).Max.x;
  bVar20 = local_88.Min.x < fVar18 || fVar2 <= local_88.Max.x;
  if (local_88.Min.x < fVar18 || fVar2 <= local_88.Max.x) {
    local_40.y = local_88.Min.y + -1.0;
    local_40.x = (float)(~-(uint)(fVar18 <= local_88.Min.x) & (uint)fVar18 |
                        -(uint)(fVar18 <= local_88.Min.x) & (uint)local_88.Min.x);
    local_90.x = fVar2;
    local_90.y = fVar19 + local_88.Min.y;
    PushClipRect(&local_40,&local_90,true);
  }
  ItemSize(&local_88,(pIVar5->Style).FramePadding.y);
  bVar6 = ItemAdd(&local_88,id,(ImRect *)0x0);
  if (!bVar6) {
    if (bVar20) {
      PopClipRect();
    }
    (local_70->DC).CursorPos = local_50;
    return (bool)local_68[0];
  }
  bVar6 = ButtonBehavior(&local_88,id,(bool *)&local_40,(bool *)&local_90,
                         (uint)pIVar5->DragDropActive << 0xc | 0x44);
  local_78 = pIVar5;
  local_40.x = (float)CONCAT31(local_40.x._1_3_,local_40.x._0_1_ | pIVar5->HoveredId == id);
  if ((bVar6) || ((flags & 2U) != 0 && local_68[0] == '\0')) {
    tab_bar->NextSelectedTabId = id;
  }
  if (local_90.x._0_1_ == '\0') {
    SetItemAllowOverlap();
    bVar7 = local_90.x._0_1_ ^ 1;
  }
  else {
    bVar7 = 0;
  }
  pIVar5 = local_78;
  if ((((iVar13 < iVar11) || ((bVar7 & 1) != 0)) || (bVar6 = IsMouseDragging(0,-1.0), !bVar6)) ||
     ((pIVar5->DragDropActive != false || ((tab_bar->Flags & 1) == 0)))) goto LAB_00151ab6;
  fVar18 = (pIVar5->IO).MouseDelta.x;
  if (fVar18 < 0.0) {
    iVar11 = -1;
    pIVar1 = &(pIVar5->IO).MousePos;
    if (local_88.Min.x < pIVar1->x || local_88.Min.x == pIVar1->x) goto LAB_00151a92;
  }
  else {
LAB_00151a92:
    if (fVar18 <= 0.0) goto LAB_00151ab6;
    iVar11 = 1;
    if ((pIVar5->IO).MousePos.x <= local_88.Max.x) goto LAB_00151ab6;
  }
  tab_bar->ReorderRequestTabId = pIVar17->ID;
  tab_bar->ReorderRequestDir = iVar11;
LAB_00151ab6:
  label_00 = local_38;
  pIVar3 = local_70;
  draw_list = local_70->DrawList;
  idx = 0x22;
  if ((local_90.x._0_1_ == '\0') && (local_40.x._0_1_ == '\0')) {
    if (local_68[0] == '\0') {
      idx = (uint)((uVar8 >> 0x16 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar8 >> 0x16 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&local_88,flags_00,col);
  RenderNavHighlight(&local_88,id,1);
  bVar6 = IsItemHovered(8);
  if ((bVar6) && ((bVar6 = IsMouseClicked(1,false), bVar6 || (bVar6 = IsMouseReleased(1), bVar6))))
  {
    tab_bar->NextSelectedTabId = id;
  }
  uVar8 = tab_bar->Flags;
  if (local_48 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = ImGuiWindow::GetID(pIVar3,(void *)((ulong)id + 1));
  }
  bVar6 = TabItemLabelAndCloseButton
                    (draw_list,&local_88,uVar8 & 4 | flags,label_00,id,close_button_id);
  pIVar5 = local_78;
  if (bVar6) {
    *local_48 = false;
    if (tab_bar->VisibleTabId == pIVar17->ID) {
      if ((pIVar17->Flags & 1U) == 0) {
        pIVar17->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if ((pIVar17->Flags & 1U) != 0) {
      tab_bar->NextSelectedTabId = pIVar17->ID;
    }
  }
  if (bVar20) {
    PopClipRect();
  }
  (pIVar3->DC).CursorPos = local_50;
  if (pIVar5->HoveredId != id) {
    return (bool)local_68[0];
  }
  if (local_90.x._0_1_ != '\0') {
    return (bool)local_68[0];
  }
  if (pIVar5->HoveredIdNotActiveTimer <= 0.5) {
    return (bool)local_68[0];
  }
  if ((tab_bar->Flags & 0x20) != 0) {
    return (bool)local_68[0];
  }
  pcVar10 = FindRenderedTextEnd(label_00,(char *)0x0);
  SetTooltip("%.*s",(ulong)(uint)((int)pcVar10 - (int)label_00),label_00);
  return (bool)local_68[0];
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->WidthContents = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2((float)(int)tab->Offset - tab_bar->ScrollingAnim, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x >= tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    hovered |= (g.HoveredId == id);
    if (pressed || ((flags & ImGuiTabItemFlags_SetSelected) && !tab_contents_visible)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->WidthContents)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + (float)(int)ImLerp(bb.GetWidth(), tab->WidthContents, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f));
        display_draw_list = GetOverlayDrawList(window);
        TabItemRenderBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, label, id, close_button_id);
    if (just_closed)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f)
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}